

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int get_length(char *file,int *byterev)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  undefined1 local_c0 [8];
  stat statbuf;
  int n;
  int length;
  FILE *fp;
  int *byterev_local;
  char *file_local;
  
  *byterev = 0;
  iVar1 = stat(file,(stat *)local_c0);
  if (iVar1 < 0) {
    printf("stat_retry(%s) failed\n",file);
    file_local._4_4_ = 0xffffffff;
  }
  else {
    __stream = fopen(file,"rb");
    if (__stream == (FILE *)0x0) {
      printf("fopen(%s,rb) failed\n",file);
      file_local._4_4_ = 0xffffffff;
    }
    else {
      sVar2 = fread((void *)((long)statbuf.__glibc_reserved + 0x14),4,1,__stream);
      if (sVar2 == 1) {
        if ((long)(int)statbuf.__glibc_reserved[2]._4_4_ * 4 + 4U != statbuf.st_rdev) {
          statbuf.__glibc_reserved[2]._0_4_ =
               (int)statbuf.__glibc_reserved[2]._4_4_ >> 0x18 & 0xffU |
               (int)statbuf.__glibc_reserved[2]._4_4_ >> 8 & 0xff00U |
               (statbuf.__glibc_reserved[2]._4_4_ & 0xff00) << 8 |
               statbuf.__glibc_reserved[2]._4_4_ << 0x18;
          if ((long)(int)(uint)statbuf.__glibc_reserved[2] * 4 + 4U != statbuf.st_rdev) {
            printf("Header size field: %d(%08x); filesize: %d(%08x)\n",
                   (ulong)statbuf.__glibc_reserved[2]._4_4_,(ulong)statbuf.__glibc_reserved[2]._4_4_
                   ,statbuf.st_rdev & 0xffffffff,statbuf.st_rdev & 0xffffffff);
            fflush(_stdout);
            fclose(__stream);
            return -1;
          }
          *byterev = 1;
          statbuf.__glibc_reserved[2]._4_4_ = (uint)statbuf.__glibc_reserved[2];
        }
        if ((int)statbuf.__glibc_reserved[2]._4_4_ < 0) {
          printf("Header size field: %d\n",(ulong)statbuf.__glibc_reserved[2]._4_4_);
          fflush(_stdout);
          fclose(__stream);
          file_local._4_4_ = 0xffffffff;
        }
        else {
          fclose(__stream);
          file_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
        }
      }
      else {
        fclose(__stream);
        file_local._4_4_ = 0xffffffff;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int get_length(char *file,
               int *byterev)
{
  FILE            *fp;
  int             length;
  int             n;
  struct stat statbuf;

  *byterev = 0;
  if (stat(file, &statbuf) < 0) {
      printf("stat_retry(%s) failed\n", file);
      return -1;
  }
  if ((fp = fopen(file, "rb")) == NULL) {
      printf("fopen(%s,rb) failed\n", file);
      return -1;
  }

  /* Read #floats in header */
  if (fread(&length, sizeof(int), 1, fp) != 1) {
      fclose (fp);
      return -1;
  }

  /* Check if length matches file size */
  if ((length*sizeof(float) + 4) != statbuf.st_size) {
      n = length;
      MYSWAP_INT(&n);

      if ((n*sizeof(float) + 4) != statbuf.st_size) {
          printf("Header size field: %d(%08x); filesize: %d(%08x)\n",
                  length, length, (int)statbuf.st_size, (int)statbuf.st_size);
          fflush(stdout);
          fclose (fp);
          return -1;
      }

      length = n;
      *byterev = 1;
  }
  if (length < 0) {
      printf("Header size field: %d\n",  length); fflush(stdout);
      fclose (fp);
      return -1;
  }
  fclose(fp);
  return length;
}